

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableHandler.hpp
# Opt level: O0

Waveform * __thiscall
trackerboy::TableHandler<trackerboy::Waveform,_1163280727U>::initItem
          (TableHandler<trackerboy::Waveform,_1163280727U> *this,InputBlock *block,
          Table<trackerboy::Waveform> *table)

{
  Waveform *pWVar1;
  InputBlock *block_00;
  string local_58;
  Waveform *local_38;
  Waveform *item;
  Table<trackerboy::Waveform> *pTStack_28;
  uint8_t id;
  Table<trackerboy::Waveform> *table_local;
  InputBlock *block_local;
  TableHandler<trackerboy::Waveform,_1163280727U> *this_local;
  
  pTStack_28 = table;
  table_local = (Table<trackerboy::Waveform> *)block;
  block_local = (InputBlock *)this;
  InputBlock::read<unsigned_char>(block,(uchar *)((long)&item + 7));
  pWVar1 = Table<trackerboy::Waveform>::operator[](pTStack_28,(uint)item._7_1_);
  if (pWVar1 == (Waveform *)0x0) {
    pWVar1 = Table<trackerboy::Waveform>::insert(pTStack_28,(uint)item._7_1_);
    local_38 = pWVar1;
    deserializeString_abi_cxx11_(&local_58,(trackerboy *)table_local,block_00);
    Named::setName(&pWVar1->super_Named,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    this_local = (TableHandler<trackerboy::Waveform,_1163280727U> *)local_38;
  }
  else {
    this_local = (TableHandler<trackerboy::Waveform,_1163280727U> *)0x0;
  }
  return (Waveform *)this_local;
}

Assistant:

T* initItem(InputBlock &block, Table<T> &table) {
        uint8_t id;
        block.read(id);

        if (table[id] != nullptr) {
            return nullptr;
        }

        auto item = table.insert(id);
        item->setName(deserializeString(block));
        return item;
    }